

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf,
                  PerConfig perConfig)

{
  cmMakefile *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__s1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  TargetType TVar5;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var6;
  string *psVar7;
  cmValue cVar8;
  cmGlobalGenerator *pcVar9;
  long *plVar10;
  cmState *pcVar11;
  _Rb_tree_node_base *p_Var12;
  size_type *psVar13;
  pointer pbVar14;
  long lVar15;
  bool bVar16;
  basic_string_view<char,_std::char_traits<char>_> __str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view arg;
  cmBTStringRange cVar17;
  string genName;
  string defKey;
  string property;
  string propValue;
  string configUpper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string local_108;
  cmMakefile *local_e8;
  string local_e0;
  string *local_c0;
  string local_b8;
  string local_98;
  string *local_78;
  string local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  string *local_38;
  
  local_78 = (string *)CONCAT44(local_78._4_4_,perConfig);
  local_c0 = name;
  _Var6._M_head_impl = (cmTargetInternals *)operator_new(0x610);
  cmTargetInternals::cmTargetInternals(_Var6._M_head_impl);
  (this->impl)._M_t.
  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
  super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl = _Var6._M_head_impl;
  if (mf == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmTarget.cxx"
                  ,0x1c1,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *, PerConfig)"
                 );
  }
  (_Var6._M_head_impl)->TargetType = type;
  (_Var6._M_head_impl)->Makefile = mf;
  local_e8 = mf;
  std::__cxx11::string::_M_assign((string *)&(_Var6._M_head_impl)->Name);
  _Var6._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  (_Var6._M_head_impl)->IsImportedTarget = vis - VisibilityImported < 2;
  (_Var6._M_head_impl)->IsAndroid = false;
  (_Var6._M_head_impl)->IsGeneratorProvided = false;
  (_Var6._M_head_impl)->HaveInstallRule = false;
  (_Var6._M_head_impl)->IsDLLPlatform = false;
  (_Var6._M_head_impl)->IsAIX = false;
  (_Var6._M_head_impl)->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  (_Var6._M_head_impl)->BuildInterfaceIncludesAppended = false;
  (_Var6._M_head_impl)->PerConfig = (int)local_78 == 0;
  pcVar1 = (_Var6._M_head_impl)->Makefile;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_c0 = (string *)this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_108);
  _Var6._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  (_Var6._M_head_impl)->IsDLLPlatform = psVar7->_M_string_length != 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,(ulong)(local_108.field_2._M_allocated_capacity + 1))
    ;
    _Var6._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  pcVar1 = (_Var6._M_head_impl)->Makefile;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CMAKE_SYSTEM_NAME","");
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,(ulong)(local_108.field_2._M_allocated_capacity + 1))
    ;
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar7);
  if (iVar4 == 0) {
    bVar16 = true;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)psVar7);
    bVar16 = iVar4 == 0;
  }
  _Var6._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  (_Var6._M_head_impl)->IsAIX = bVar16;
  pcVar1 = (_Var6._M_head_impl)->Makefile;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CMAKE_SYSTEM_NAME","");
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_108);
  iVar4 = std::__cxx11::string::compare((char *)psVar7);
  ((this->impl)._M_t.
   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
   super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsAndroid = iVar4 == 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,(ulong)(local_108.field_2._M_allocated_capacity + 1))
    ;
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_e0);
  std::__cxx11::string::append((char *)&local_e0);
  _Var6._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if (((_Var6._M_head_impl)->IsImportedTarget == false) && ((_Var6._M_head_impl)->TargetType < 5)) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"C_COMPILER_LAUNCHER","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"C_STANDARD","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"C_STANDARD_REQUIRED","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"C_EXTENSIONS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"C_VISIBILITY_PRESET","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"OBJC_COMPILER_LAUNCHER","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"OBJC_STANDARD","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"OBJC_STANDARD_REQUIRED","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"OBJC_EXTENSIONS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"OBJC_VISIBILITY_PRESET","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CXX_COMPILER_LAUNCHER","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CXX_STANDARD","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CXX_STANDARD_REQUIRED","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CXX_EXTENSIONS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CXX_VISIBILITY_PRESET","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"OBJCXX_COMPILER_LAUNCHER","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"OBJCXX_STANDARD","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"OBJCXX_STANDARD_REQUIRED","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"OBJCXX_EXTENSIONS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"OBJCXX_VISIBILITY_PRESET","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CUDA_COMPILER_LAUNCHER","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CUDA_STANDARD","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CUDA_STANDARD_REQUIRED","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CUDA_EXTENSIONS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CUDA_VISIBILITY_PRESET","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"HIP_COMPILER_LAUNCHER","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"HIP_STANDARD","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"HIP_STANDARD_REQUIRED","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"HIP_EXTENSIONS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"HIP_VISIBILITY_PRESET","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ANDROID_API","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ANDROID_API_MIN","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ANDROID_ARCH","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ANDROID_STL_TYPE","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ANDROID_SKIP_ANT_STEP","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ANDROID_PROCESS_MAX","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ANDROID_PROGUARD","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"ANDROID_PROGUARD_CONFIG_PATH","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"ANDROID_SECURE_PROPS_PATH","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"ANDROID_NATIVE_LIB_DIRECTORIES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"ANDROID_NATIVE_LIB_DEPENDENCIES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"ANDROID_JAVA_SOURCE_DIR","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"ANDROID_JAR_DIRECTORIES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"ANDROID_JAR_DEPENDENCIES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"ANDROID_ASSETS_DIRECTORIES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"ANDROID_ANT_ADDITIONAL_OPTIONS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"BUILD_RPATH","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"BUILD_RPATH_USE_ORIGIN","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"INSTALL_NAME_DIR","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"INSTALL_REMOVE_ENVIRONMENT_RPATH","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"INSTALL_RPATH","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value == (string *)0x0) {
      StoreProperty<char_const*>(this,&local_108,"");
    }
    else {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"INSTALL_RPATH_USE_LINK_PATH","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value == (string *)0x0) {
      StoreProperty<char_const*>(this,&local_108,"OFF");
    }
    else {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"INTERPROCEDURAL_OPTIMIZATION","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"SKIP_BUILD_RPATH","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value == (string *)0x0) {
      StoreProperty<char_const*>(this,&local_108,"OFF");
    }
    else {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"BUILD_WITH_INSTALL_RPATH","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value == (string *)0x0) {
      StoreProperty<char_const*>(this,&local_108,"OFF");
    }
    else {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"ARCHIVE_OUTPUT_DIRECTORY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"LIBRARY_OUTPUT_DIRECTORY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"RUNTIME_OUTPUT_DIRECTORY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"PDB_OUTPUT_DIRECTORY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"COMPILE_PDB_OUTPUT_DIRECTORY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"FRAMEWORK","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"FRAMEWORK_MULTI_CONFIG_POSTFIX","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Fortran_FORMAT","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"Fortran_MODULE_DIRECTORY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"Fortran_COMPILER_LAUNCHER","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Fortran_PREPROCESS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"Fortran_VISIBILITY_PRESET","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"GNUtoMS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"OSX_ARCHITECTURES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"IOS_INSTALL_COMBINED","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"AUTOMOC","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"AUTOUIC","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"AUTORCC","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"AUTOGEN_ORIGIN_DEPENDS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"AUTOGEN_PARALLEL","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"AUTOMOC_COMPILER_PREDEFINES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"AUTOMOC_DEPEND_FILTERS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"AUTOMOC_MACRO_NAMES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"AUTOMOC_MOC_OPTIONS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"AUTOUIC_OPTIONS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"AUTOMOC_PATH_PREFIX","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"AUTOUIC_SEARCH_PATHS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"AUTORCC_OPTIONS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"LINK_DEPENDS_NO_SHARED","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"LINK_INTERFACE_LIBRARIES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"MSVC_DEBUG_INFORMATION_FORMAT","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"MSVC_RUNTIME_LIBRARY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"WATCOM_RUNTIME_LIBRARY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"WIN32_EXECUTABLE","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"MACOSX_BUNDLE","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"MACOSX_RPATH","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"NO_SYSTEM_FROM_IMPORTED","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"BUILD_WITH_INSTALL_NAME_DIR","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"C_CLANG_TIDY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"C_CPPLINT","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"C_CPPCHECK","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"C_INCLUDE_WHAT_YOU_USE","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"C_LINKER_LAUNCHER","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"LINK_WHAT_YOU_USE","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CXX_CLANG_TIDY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CXX_CPPLINT","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CXX_CPPCHECK","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CXX_INCLUDE_WHAT_YOU_USE","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CXX_LINKER_LAUNCHER","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CUDA_SEPARABLE_COMPILATION","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CUDA_RUNTIME_LIBRARY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CUDA_ARCHITECTURES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"HIP_RUNTIME_LIBRARY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"HIP_ARCHITECTURES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"VISIBILITY_INLINES_HIDDEN","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"JOB_POOL_COMPILE","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"JOB_POOL_LINK","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"JOB_POOL_PRECOMPILE_HEADER","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"ISPC_COMPILER_LAUNCHER","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ISPC_HEADER_DIRECTORY","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ISPC_HEADER_SUFFIX","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value == (string *)0x0) {
      StoreProperty<char_const*>(this,&local_108,"_ispc.h");
    }
    else {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ISPC_INSTRUCTION_SETS","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"LINK_SEARCH_START_STATIC","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"LINK_SEARCH_END_STATIC","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"OBJC_CLANG_TIDY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"OBJC_LINKER_LAUNCHER","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"OBJCXX_CLANG_TIDY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"OBJCXX_LINKER_LAUNCHER","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"Swift_LANGUAGE_VERSION","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"Swift_MODULE_DIRECTORY","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"VS_JUST_MY_CODE_DEBUGGING","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"VS_NO_COMPILE_BATCHING","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"DISABLE_PRECOMPILE_HEADERS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"UNITY_BUILD","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"UNITY_BUILD_UNIQUE_ID","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"OPTIMIZE_DEPENDENCIES","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"EXPORT_COMPILE_COMMANDS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"COMPILE_WARNING_AS_ERROR","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"UNITY_BUILD_BATCH_SIZE","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value == (string *)0x0) {
      StoreProperty<char_const*>(this,&local_108,"8");
    }
    else {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"UNITY_BUILD_MODE","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value == (string *)0x0) {
      StoreProperty<char_const*>(this,&local_108,"BATCH");
    }
    else {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"PCH_WARN_INVALID","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value == (string *)0x0) {
      StoreProperty<char_const*>(this,&local_108,"ON");
    }
    else {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"PCH_INSTANTIATE_TEMPLATES","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value == (string *)0x0) {
      StoreProperty<char_const*>(this,&local_108,"ON");
    }
    else {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"FOLDER","");
  std::__cxx11::string::replace
            ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
             (ulong)local_108._M_dataplus._M_p);
  cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
  if (cVar8.Value != (string *)0x0) {
    StoreProperty<cmValue>(this,&local_108,cVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,(ulong)(local_108.field_2._M_allocated_capacity + 1))
    ;
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"VERIFY_INTERFACE_HEADER_SETS","");
  std::__cxx11::string::replace
            ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
             (ulong)local_108._M_dataplus._M_p);
  cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
  if (cVar8.Value != (string *)0x0) {
    StoreProperty<cmValue>(this,&local_108,cVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,(ulong)(local_108.field_2._M_allocated_capacity + 1))
    ;
  }
  pcVar9 = cmMakefile::GetGlobalGenerator
                     (((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
  iVar4 = (*pcVar9->_vptr_cmGlobalGenerator[0x27])(pcVar9);
  if ((char)iVar4 != '\0') {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"XCODE_GENERATE_SCHEME","")
    ;
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
  }
  _Var6._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if (1 < (_Var6._M_head_impl)->TargetType - 5) {
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_50,local_e8,ExcludeEmptyConfig);
    local_38 = local_50.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar14 = local_50.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_78 = pbVar14;
        cmsys::SystemTools::UpperCase(&local_70,pbVar14);
        lVar15 = 0;
        do {
          __s1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&cmTarget(std::__cxx11::string_const&,cmStateEnums::TargetType,cmTarget::Visibility,cmMakefile*,cmTarget::PerConfig)
                          ::configProps + lVar15);
          if ((((((unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_> *)
                 &local_c0->_M_dataplus)->_M_t).
                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 7)
             || (iVar4 = strcmp((char *)__s1,"MAP_IMPORTED_CONFIG_"), iVar4 == 0)) {
            local_108._M_dataplus._M_p = (pointer)strlen((char *)__s1);
            local_108.field_2._M_allocated_capacity = local_70._M_string_length;
            local_108.field_2._8_8_ = local_70._M_dataplus._M_p;
            views._M_len = 2;
            views._M_array = (iterator)&local_108;
            local_108._M_string_length = (size_type)__s1;
            cmCatViews_abi_cxx11_(&local_b8,views);
            std::__cxx11::string::replace
                      ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
                       (ulong)local_b8._M_dataplus._M_p);
            cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
            if (cVar8.Value != (string *)0x0) {
              StoreProperty<cmValue>((cmTarget *)local_c0,&local_b8,cVar8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
          psVar7 = local_78;
          this = (cmTarget *)local_c0;
          lVar15 = lVar15 + 8;
        } while (lVar15 != 0x38);
        iVar4 = ((((unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_> *)
                  &local_c0->_M_dataplus)->_M_t).
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
        if ((iVar4 != 0) && (iVar4 != 7)) {
          cmsys::SystemTools::UpperCase(&local_98,local_78);
          local_108._M_dataplus._M_p = (pointer)local_98._M_string_length;
          local_108._M_string_length = (size_type)local_98._M_dataplus._M_p;
          local_108.field_2._M_allocated_capacity = 8;
          local_108.field_2._8_8_ = (long)"FRAMEWORK_MULTI_CONFIG_POSTFIX" + 0x16;
          views_00._M_len = 2;
          views_00._M_array = (iterator)&local_108;
          cmCatViews_abi_cxx11_(&local_b8,views_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::replace
                    ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
                     (ulong)local_b8._M_dataplus._M_p);
          cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
          if (cVar8.Value != (string *)0x0) {
            StoreProperty<cmValue>(this,&local_b8,cVar8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          iVar4 = ((((unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_> *)
                    &((string *)this)->_M_dataplus)->_M_t).
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
        }
        if (iVar4 - 1U < 2) {
          cmsys::SystemTools::UpperCase(&local_98,psVar7);
          local_108._M_dataplus._M_p = (pointer)0x1f;
          local_108._M_string_length = 0x762b0f;
          local_108.field_2._M_allocated_capacity = local_98._M_string_length;
          local_108.field_2._8_8_ = local_98._M_dataplus._M_p;
          views_01._M_len = 2;
          views_01._M_array = (iterator)&local_108;
          cmCatViews_abi_cxx11_(&local_b8,views_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::replace
                    ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
                     (ulong)local_b8._M_dataplus._M_p);
          cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
          if (cVar8.Value != (string *)0x0) {
            StoreProperty<cmValue>(this,&local_b8,cVar8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pbVar14 = psVar7 + 1;
      } while (pbVar14 != local_38);
    }
    if (((this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == false)
    {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"LINK_LIBRARIES_ONLY_TARGETS","");
      std::__cxx11::string::replace
                ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
                 (ulong)local_108._M_dataplus._M_p);
      cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
      if (cVar8.Value != (string *)0x0) {
        StoreProperty<cmValue>(this,&local_108,cVar8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,
                        (ulong)(local_108.field_2._M_allocated_capacity + 1));
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
    _Var6._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  cmMakefile::GetBacktrace((_Var6._M_head_impl)->Makefile);
  sVar3 = local_108._M_string_length;
  _Var2._M_p = local_108._M_dataplus._M_p;
  _Var6._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  this_00._M_pi =
       ((_Var6._M_head_impl)->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
       TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  *(pointer *)
   &((_Var6._M_head_impl)->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace> =
       _Var2._M_p;
  ((_Var6._M_head_impl)->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
  TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
  if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length);
  }
  _Var6._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var6._M_head_impl)->IsImportedTarget == false) {
    cVar17 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_((_Var6._M_head_impl)->Makefile);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &(_Var6._M_head_impl)->IncludeDirectoriesEntries,
               ((_Var6._M_head_impl)->IncludeDirectoriesEntries).
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar17.Begin._M_current._M_current,
               cVar17.End._M_current._M_current);
    _Var6._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    pcVar1 = (_Var6._M_head_impl)->Makefile;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(_Var6._M_head_impl)->SystemIncludeDirectories,
               (pcVar1->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left,&(pcVar1->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header.
                        _M_header);
    _Var6._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    cVar17 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_((_Var6._M_head_impl)->Makefile);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &(_Var6._M_head_impl)->CompileOptionsEntries,
               ((_Var6._M_head_impl)->CompileOptionsEntries).
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar17.Begin._M_current._M_current,
               cVar17.End._M_current._M_current);
    _Var6._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    cVar17 = cmMakefile::GetLinkOptionsEntries_abi_cxx11_((_Var6._M_head_impl)->Makefile);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &(_Var6._M_head_impl)->LinkOptionsEntries,
               ((_Var6._M_head_impl)->LinkOptionsEntries).
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar17.Begin._M_current._M_current,
               cVar17.End._M_current._M_current);
    _Var6._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    cVar17 = cmMakefile::GetLinkDirectoriesEntries_abi_cxx11_((_Var6._M_head_impl)->Makefile);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &(_Var6._M_head_impl)->LinkDirectoriesEntries,
               ((_Var6._M_head_impl)->LinkDirectoriesEntries).
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar17.Begin._M_current._M_current,
               cVar17.End._M_current._M_current);
    _Var6._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  TVar5 = (_Var6._M_head_impl)->TargetType;
  if (TVar5 == EXECUTABLE) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ANDROID_GUI","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CROSSCOMPILING_EMULATOR","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ENABLE_EXPORTS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    _Var6._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    TVar5 = (_Var6._M_head_impl)->TargetType;
  }
  if ((TVar5 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"POSITION_INDEPENDENT_CODE","");
    StoreProperty<char_const*>(this,&local_108,"True");
LAB_002ea67a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
  }
  else if ((TVar5 < UTILITY) && ((_Var6._M_head_impl)->IsImportedTarget == false)) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"POSITION_INDEPENDENT_CODE","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    goto LAB_002ea67a;
  }
  _Var6._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if (((_Var6._M_head_impl)->TargetType & 0xfffffffd) == 0) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"AIX_EXPORT_ALL_SYMBOLS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"WINDOWS_EXPORT_ALL_SYMBOLS","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    _Var6._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  cmMakefile::RecordPolicies((_Var6._M_head_impl)->Makefile,&(_Var6._M_head_impl)->PolicyMap);
  _Var6._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var6._M_head_impl)->TargetType == 7) {
    cmPolicies::PolicyMap::Set(&(_Var6._M_head_impl)->PolicyMap,CMP0022,NEW);
    _Var6._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  if ((_Var6._M_head_impl)->IsImportedTarget == false) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"DOTNET_SDK","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    _Var6._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  if ((int)(_Var6._M_head_impl)->TargetType < 7) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"DOTNET_TARGET_FRAMEWORK","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"DOTNET_TARGET_FRAMEWORK_VERSION","");
    std::__cxx11::string::replace
              ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
               (ulong)local_108._M_dataplus._M_p);
    cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
    if (cVar8.Value != (string *)0x0) {
      StoreProperty<cmValue>(this,&local_108,cVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CMAKE_VS_GLOBALS","");
  cVar8 = cmMakefile::GetDefinition(local_e8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,(ulong)(local_108.field_2._M_allocated_capacity + 1))
    ;
  }
  if (cVar8.Value != (string *)0x0) {
    pcVar9 = cmMakefile::GetGlobalGenerator(local_e8);
    (*pcVar9->_vptr_cmGlobalGenerator[3])(&local_108);
    local_70._M_dataplus._M_p = (pointer)local_108._M_string_length;
    local_70._M_string_length = (size_type)local_108._M_dataplus._M_p;
    __str._M_str = "Visual Studio";
    __str._M_len = 0xd;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_70,0,0xd,__str);
    if (iVar4 == 0) {
      arg._M_str = ((cVar8.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar8.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_(&local_50,arg,false);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"VS_GLOBAL_","");
      if (local_50.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_50.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar14 = local_50.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          lVar15 = std::__cxx11::string::find((char)pbVar14,0x3d);
          if (lVar15 != -1) {
            std::__cxx11::string::substr((ulong)&local_98,(ulong)pbVar14);
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_98,0,(char *)0x0,
                                         (ulong)local_70._M_dataplus._M_p);
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_b8.field_2._M_allocated_capacity = *psVar13;
              local_b8.field_2._8_8_ = plVar10[3];
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar13;
              local_b8._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_b8._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_98,(ulong)pbVar14);
            _Var2._M_p = local_98._M_dataplus._M_p;
            std::__cxx11::string::replace
                      ((ulong)&local_e0,6,(char *)(local_e0._M_string_length - 6),
                       (ulong)local_b8._M_dataplus._M_p);
            cVar8 = cmMakefile::GetDefinition(local_e8,&local_e0);
            if (cVar8.Value == (string *)0x0) {
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var2._M_p !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                StoreProperty<char_const*>((cmTarget *)local_c0,&local_b8,_Var2._M_p);
              }
            }
            else {
              StoreProperty<cmValue>((cmTarget *)local_c0,&local_b8,cVar8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
          pbVar14 = pbVar14 + 1;
        } while (pbVar14 !=
                 local_50.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_50);
      this = (cmTarget *)local_c0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
  }
  if (((this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == false) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"SYSTEM","");
    bVar16 = cmMakefile::GetPropertyAsBool(local_e8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    if (!bVar16) goto LAB_002eacb9;
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"SYSTEM","");
  StoreProperty<char_const*>(this,&local_108,"ON");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,(ulong)(local_108.field_2._M_allocated_capacity + 1))
    ;
  }
LAB_002eacb9:
  pcVar11 = cmMakefile::GetState(local_e8);
  for (p_Var12 = (pcVar11->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
      (_Rb_tree_header *)p_Var12 !=
      &(pcVar11->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header;
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    if (((p_Var12[2]._M_color == _S_red) && (p_Var12[4]._M_right != (_Base_ptr)0x0)) &&
       (cVar8 = cmMakefile::GetDefinition(local_e8,(string *)&p_Var12[4]._M_left),
       cVar8.Value != (string *)0x0)) {
      StoreProperty<cmValue>(this,(string *)(p_Var12 + 1),cVar8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf, PerConfig perConfig)
  : impl(cm::make_unique<cmTargetInternals>())
{
  assert(mf);
  this->impl->TargetType = type;
  this->impl->Makefile = mf;
  this->impl->Name = name;
  this->impl->IsGeneratorProvided = false;
  this->impl->HaveInstallRule = false;
  this->impl->IsDLLPlatform = false;
  this->impl->IsAIX = false;
  this->impl->IsAndroid = false;
  this->impl->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  this->impl->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->impl->BuildInterfaceIncludesAppended = false;
  this->impl->PerConfig = (perConfig == PerConfig::Yes);

  // Check whether this is a DLL platform.
  this->impl->IsDLLPlatform =
    !this->impl->Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")
       .empty();

  // Check whether we are targeting AIX.
  {
    std::string const& systemName =
      this->impl->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME");
    this->impl->IsAIX = (systemName == "AIX" || systemName == "OS400");
  }

  // Check whether we are targeting an Android platform.
  this->impl->IsAndroid = (this->impl->Makefile->GetSafeDefinition(
                             "CMAKE_SYSTEM_NAME") == "Android");

  std::string defKey;
  defKey.reserve(128);
  defKey += "CMAKE_";
  auto initProp = [this, mf, &defKey](const std::string& property) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (cmValue value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    }
  };
  auto initPropValue = [this, mf, &defKey](const std::string& property,
                                           const char* default_value) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (cmValue value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    } else if (default_value) {
      this->SetProperty(property, default_value);
    }
  };

  // Setup default property values.
  if (this->CanCompileSources()) {

    SETUP_COMMON_LANGUAGE_PROPERTIES(C);
    SETUP_COMMON_LANGUAGE_PROPERTIES(OBJC);
    SETUP_COMMON_LANGUAGE_PROPERTIES(CXX);
    SETUP_COMMON_LANGUAGE_PROPERTIES(OBJCXX);
    SETUP_COMMON_LANGUAGE_PROPERTIES(CUDA);
    SETUP_COMMON_LANGUAGE_PROPERTIES(HIP);

    initProp("ANDROID_API");
    initProp("ANDROID_API_MIN");
    initProp("ANDROID_ARCH");
    initProp("ANDROID_STL_TYPE");
    initProp("ANDROID_SKIP_ANT_STEP");
    initProp("ANDROID_PROCESS_MAX");
    initProp("ANDROID_PROGUARD");
    initProp("ANDROID_PROGUARD_CONFIG_PATH");
    initProp("ANDROID_SECURE_PROPS_PATH");
    initProp("ANDROID_NATIVE_LIB_DIRECTORIES");
    initProp("ANDROID_NATIVE_LIB_DEPENDENCIES");
    initProp("ANDROID_JAVA_SOURCE_DIR");
    initProp("ANDROID_JAR_DIRECTORIES");
    initProp("ANDROID_JAR_DEPENDENCIES");
    initProp("ANDROID_ASSETS_DIRECTORIES");
    initProp("ANDROID_ANT_ADDITIONAL_OPTIONS");
    initProp("BUILD_RPATH");
    initProp("BUILD_RPATH_USE_ORIGIN");
    initProp("INSTALL_NAME_DIR");
    initProp("INSTALL_REMOVE_ENVIRONMENT_RPATH");
    initPropValue("INSTALL_RPATH", "");
    initPropValue("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    initProp("INTERPROCEDURAL_OPTIMIZATION");
    initPropValue("SKIP_BUILD_RPATH", "OFF");
    initPropValue("BUILD_WITH_INSTALL_RPATH", "OFF");
    initProp("ARCHIVE_OUTPUT_DIRECTORY");
    initProp("LIBRARY_OUTPUT_DIRECTORY");
    initProp("RUNTIME_OUTPUT_DIRECTORY");
    initProp("PDB_OUTPUT_DIRECTORY");
    initProp("COMPILE_PDB_OUTPUT_DIRECTORY");
    initProp("FRAMEWORK");
    initProp("FRAMEWORK_MULTI_CONFIG_POSTFIX");
    initProp("Fortran_FORMAT");
    initProp("Fortran_MODULE_DIRECTORY");
    initProp("Fortran_COMPILER_LAUNCHER");
    initProp("Fortran_PREPROCESS");
    initProp("Fortran_VISIBILITY_PRESET");
    initProp("GNUtoMS");
    initProp("OSX_ARCHITECTURES");
    initProp("IOS_INSTALL_COMBINED");
    initProp("AUTOMOC");
    initProp("AUTOUIC");
    initProp("AUTORCC");
    initProp("AUTOGEN_ORIGIN_DEPENDS");
    initProp("AUTOGEN_PARALLEL");
    initProp("AUTOMOC_COMPILER_PREDEFINES");
    initProp("AUTOMOC_DEPEND_FILTERS");
    initProp("AUTOMOC_MACRO_NAMES");
    initProp("AUTOMOC_MOC_OPTIONS");
    initProp("AUTOUIC_OPTIONS");
    initProp("AUTOMOC_PATH_PREFIX");
    initProp("AUTOUIC_SEARCH_PATHS");
    initProp("AUTORCC_OPTIONS");
    initProp("LINK_DEPENDS_NO_SHARED");
    initProp("LINK_INTERFACE_LIBRARIES");
    initProp("MSVC_DEBUG_INFORMATION_FORMAT");
    initProp("MSVC_RUNTIME_LIBRARY");
    initProp("WATCOM_RUNTIME_LIBRARY");
    initProp("WIN32_EXECUTABLE");
    initProp("MACOSX_BUNDLE");
    initProp("MACOSX_RPATH");
    initProp("NO_SYSTEM_FROM_IMPORTED");
    initProp("BUILD_WITH_INSTALL_NAME_DIR");
    initProp("C_CLANG_TIDY");
    initProp("C_CPPLINT");
    initProp("C_CPPCHECK");
    initProp("C_INCLUDE_WHAT_YOU_USE");
    initProp("C_LINKER_LAUNCHER");
    initProp("LINK_WHAT_YOU_USE");
    initProp("CXX_CLANG_TIDY");
    initProp("CXX_CPPLINT");
    initProp("CXX_CPPCHECK");
    initProp("CXX_INCLUDE_WHAT_YOU_USE");
    initProp("CXX_LINKER_LAUNCHER");
    initProp("CUDA_SEPARABLE_COMPILATION");
    initProp("CUDA_RESOLVE_DEVICE_SYMBOLS");
    initProp("CUDA_RUNTIME_LIBRARY");
    initProp("CUDA_ARCHITECTURES");
    initProp("HIP_RUNTIME_LIBRARY");
    initProp("HIP_ARCHITECTURES");
    initProp("VISIBILITY_INLINES_HIDDEN");
    initProp("JOB_POOL_COMPILE");
    initProp("JOB_POOL_LINK");
    initProp("JOB_POOL_PRECOMPILE_HEADER");
    initProp("ISPC_COMPILER_LAUNCHER");
    initProp("ISPC_HEADER_DIRECTORY");
    initPropValue("ISPC_HEADER_SUFFIX", "_ispc.h");
    initProp("ISPC_INSTRUCTION_SETS");
    initProp("LINK_SEARCH_START_STATIC");
    initProp("LINK_SEARCH_END_STATIC");
    initProp("OBJC_CLANG_TIDY");
    initProp("OBJC_LINKER_LAUNCHER");
    initProp("OBJCXX_CLANG_TIDY");
    initProp("OBJCXX_LINKER_LAUNCHER");
    initProp("Swift_LANGUAGE_VERSION");
    initProp("Swift_MODULE_DIRECTORY");
    initProp("VS_JUST_MY_CODE_DEBUGGING");
    initProp("VS_NO_COMPILE_BATCHING");
    initProp("DISABLE_PRECOMPILE_HEADERS");
    initProp("UNITY_BUILD");
    initProp("UNITY_BUILD_UNIQUE_ID");
    initProp("OPTIMIZE_DEPENDENCIES");
    initProp("EXPORT_COMPILE_COMMANDS");
    initProp("COMPILE_WARNING_AS_ERROR");
    initPropValue("UNITY_BUILD_BATCH_SIZE", "8");
    initPropValue("UNITY_BUILD_MODE", "BATCH");
    initPropValue("PCH_WARN_INVALID", "ON");
    initPropValue("PCH_INSTANTIATE_TEMPLATES", "ON");

#ifdef __APPLE__
    if (this->GetGlobalGenerator()->IsXcode()) {
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER");
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN");
      initProp("XCODE_SCHEME_DEBUG_DOCUMENT_VERSIONING");
      initProp("XCODE_SCHEME_ENABLE_GPU_FRAME_CAPTURE_MODE");
      initProp("XCODE_SCHEME_THREAD_SANITIZER");
      initProp("XCODE_SCHEME_THREAD_SANITIZER_STOP");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP");
      initProp("XCODE_SCHEME_LAUNCH_CONFIGURATION");
      initProp("XCODE_SCHEME_ENABLE_GPU_API_VALIDATION");
      initProp("XCODE_SCHEME_ENABLE_GPU_SHADER_VALIDATION");
      initProp("XCODE_SCHEME_WORKING_DIRECTORY");
      initProp("XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER");
      initProp("XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP");
      initProp("XCODE_SCHEME_MALLOC_SCRIBBLE");
      initProp("XCODE_SCHEME_MALLOC_GUARD_EDGES");
      initProp("XCODE_SCHEME_GUARD_MALLOC");
      initProp("XCODE_SCHEME_LAUNCH_MODE");
      initProp("XCODE_SCHEME_ZOMBIE_OBJECTS");
      initProp("XCODE_SCHEME_MALLOC_STACK");
      initProp("XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE");
      initProp("XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS");
      initProp("XCODE_SCHEME_ENVIRONMENT");
      initPropValue("XCODE_LINK_BUILD_PHASE_MODE", "NONE");
    }
#endif
  }

  initProp("FOLDER");
  initProp("VERIFY_INTERFACE_HEADER_SETS");

  if (this->GetGlobalGenerator()->IsXcode()) {
    initProp("XCODE_GENERATE_SCHEME");
  }

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY &&
      this->GetType() != cmStateEnums::GLOBAL_TARGET) {
    static const auto configProps = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_"
    };
    // Collect the set of configuration types.
    std::vector<std::string> configNames =
      mf->GetGeneratorConfigs(cmMakefile::ExcludeEmptyConfig);
    for (std::string const& configName : configNames) {
      std::string configUpper = cmSystemTools::UpperCase(configName);
      for (auto const& prop : configProps) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (this->impl->TargetType == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(prop, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = cmStrCat(prop, configUpper);
        initProp(property);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (this->impl->TargetType != cmStateEnums::EXECUTABLE &&
          this->impl->TargetType != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property =
          cmStrCat(cmSystemTools::UpperCase(configName), "_POSTFIX");
        initProp(property);
      }

      if (this->impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
          this->impl->TargetType == cmStateEnums::STATIC_LIBRARY) {
        std::string property = cmStrCat("FRAMEWORK_MULTI_CONFIG_POSTFIX_",
                                        cmSystemTools::UpperCase(configName));
        initProp(property);
      }
    }
    if (!this->IsImported()) {
      initProp("LINK_LIBRARIES_ONLY_TARGETS");
    }
  }

  // Save the backtrace of target construction.
  this->impl->Backtrace = this->impl->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    cm::append(this->impl->IncludeDirectoriesEntries,
               this->impl->Makefile->GetIncludeDirectoriesEntries());

    {
      auto const& sysInc = this->impl->Makefile->GetSystemIncludeDirectories();
      this->impl->SystemIncludeDirectories.insert(sysInc.begin(),
                                                  sysInc.end());
    }

    cm::append(this->impl->CompileOptionsEntries,
               this->impl->Makefile->GetCompileOptionsEntries());

    cm::append(this->impl->LinkOptionsEntries,
               this->impl->Makefile->GetLinkOptionsEntries());

    cm::append(this->impl->LinkDirectoriesEntries,
               this->impl->Makefile->GetLinkDirectoriesEntries());
  }

  if (this->impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("ANDROID_GUI");
    initProp("CROSSCOMPILING_EMULATOR");
    initProp("ENABLE_EXPORTS");
  }
  if (this->impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      this->impl->TargetType == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  } else if (this->CanCompileSources()) {
    initProp("POSITION_INDEPENDENT_CODE");
  }
  if (this->impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      this->impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("AIX_EXPORT_ALL_SYMBOLS");
    initProp("WINDOWS_EXPORT_ALL_SYMBOLS");
  }

  // Record current policies for later use.
  this->impl->Makefile->RecordPolicies(this->impl->PolicyMap);

  if (this->impl->TargetType == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    this->impl->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (!this->IsImported()) {
    initProp("DOTNET_SDK");
  }

  if (this->impl->TargetType <= cmStateEnums::GLOBAL_TARGET) {
    initProp("DOTNET_TARGET_FRAMEWORK");
    initProp("DOTNET_TARGET_FRAMEWORK_VERSION");
  }

  // check for "CMAKE_VS_GLOBALS" variable and set up target properties
  // if any
  cmValue globals = mf->GetDefinition("CMAKE_VS_GLOBALS");
  if (globals) {
    const std::string genName = mf->GetGlobalGenerator()->GetName();
    if (cmHasLiteralPrefix(genName, "Visual Studio")) {
      std::vector<std::string> props = cmExpandedList(*globals);
      const std::string vsGlobal = "VS_GLOBAL_";
      for (const std::string& i : props) {
        // split NAME=VALUE
        const std::string::size_type assignment = i.find('=');
        if (assignment != std::string::npos) {
          const std::string propName = vsGlobal + i.substr(0, assignment);
          const std::string propValue = i.substr(assignment + 1);
          initPropValue(propName, propValue.c_str());
        }
      }
    }
  }

  if (this->IsImported() || mf->GetPropertyAsBool("SYSTEM")) {
    this->SetProperty("SYSTEM", "ON");
  }

  for (auto const& prop : mf->GetState()->GetPropertyDefinitions().GetMap()) {
    if (prop.first.second == cmProperty::TARGET &&
        !prop.second.GetInitializeFromVariable().empty()) {
      if (auto value =
            mf->GetDefinition(prop.second.GetInitializeFromVariable())) {
        this->SetProperty(prop.first.first, value);
      }
    }
  }
}